

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::GetDefaultMessageInstance(Reflection *this,FieldDescriptor *field)

{
  MessageFactory *pMVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  MessageFactory *pMVar3;
  OneofDescriptor *pOVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  Message *pMVar6;
  long *plVar7;
  undefined8 extraout_RDX;
  undefined4 extraout_var_00;
  
  pMVar1 = this->message_factory_;
  pMVar3 = MessageFactory::generated_factory();
  if (pMVar1 == pMVar3) {
    pMVar6 = (Message *)(field->field_20).default_value_int64_t_;
    if (pMVar6 == (Message *)0x0) {
      pMVar1 = this->message_factory_;
      pDVar5 = FieldDescriptor::message_type(field);
      iVar2 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar5);
      pMVar6 = (Message *)CONCAT44(extraout_var_00,iVar2);
      (field->field_20).default_value_int64_t_ = (int64_t)pMVar6;
    }
    return pMVar6;
  }
  if ((((field->field_0x1 & 8) == 0) && ((field->options_->field_0)._impl_.weak_ == false)) &&
     (pOVar4 = FieldDescriptor::real_containing_oneof(field), pOVar4 == (OneofDescriptor *)0x0)) {
    plVar7 = (long *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
    if ((Message *)*plVar7 != (Message *)0x0) {
      return (Message *)*plVar7;
    }
  }
  pMVar1 = this->message_factory_;
  pDVar5 = FieldDescriptor::message_type(field);
  UNRECOVERED_JUMPTABLE = pMVar1->_vptr_MessageFactory[2];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pMVar1,pDVar5,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return (Message *)CONCAT44(extraout_var,iVar2);
}

Assistant:

const Message* Reflection::GetDefaultMessageInstance(
    const FieldDescriptor* field) const {
  // If we are using the generated factory, we cache the prototype in the field
  // descriptor for faster access.
  // The default instances of generated messages are not cross-linked, which
  // means they contain null pointers on their message fields and can't be used
  // to get the default of submessages.
  if (message_factory_ == MessageFactory::generated_factory()) {
    auto& ptr = field->default_generated_instance_;
    auto* res = ptr.load(std::memory_order_acquire);
    if (res == nullptr) {
      // First time asking for this field's default. Load it and cache it.
      res = message_factory_->GetPrototype(field->message_type());
      ptr.store(res, std::memory_order_release);
    }
    return res;
  }

  // For other factories, we try the default's object field.
  // In particular, the DynamicMessageFactory will cross link the default
  // instances to allow for this. But only do this for real fields.
  // This is an optimization to avoid going to GetPrototype() below, as that
  // requires a lock and a map lookup.
  if (!field->is_extension() && !field->options().weak() &&
      !IsLazyField(field) && !schema_.InRealOneof(field)) {
    auto* res = DefaultRaw<const Message*>(field);
    if (res != nullptr) {
      return res;
    }
  }
  // Otherwise, just go to the factory.
  return message_factory_->GetPrototype(field->message_type());
}